

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O0

float vkt::sr::anon_unknown_0::convertFloatFlushToZeroRtn
                (float value,int minExponent,int numAccurateBits)

{
  bool bVar1;
  int iVar2;
  StorageType SVar3;
  float fVar4;
  float fVar5;
  Float<unsigned_int,_8,_23,_127,_3U> local_30;
  Float<unsigned_int,_8,_23,_127,_3U> local_2c;
  Float<unsigned_int,_8,_23,_127,_3U> local_28;
  uint local_24;
  int local_20;
  deUint32 truncMask;
  int numTruncatedBits;
  Float32 inputFloat;
  int numAccurateBits_local;
  int minExponent_local;
  float value_local;
  
  if ((value != 0.0) || (NAN(value))) {
    numTruncatedBits = numAccurateBits;
    inputFloat.m_value = minExponent;
    tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float
              ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask,value);
    local_20 = 0x17 - numTruncatedBits;
    local_24 = (1 << ((byte)local_20 & 0x1f)) - 1;
    if (value <= 0.0) {
      SVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa
                        ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
      minExponent_local = (int)value;
      if ((SVar3 & local_24) != 0) {
        iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
        SVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
        local_30 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                             (-1,iVar2,SVar3 & (local_24 ^ 0xffffffff));
        fVar4 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_30);
        iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
        fVar5 = getSingleULPForExponent(iVar2,numTruncatedBits);
        minExponent_local = (int)(fVar4 - fVar5);
      }
    }
    else {
      bVar1 = false;
      if (0.0 < value) {
        tcu::Float<unsigned_int,_8,_23,_127,_3U>::Float(&local_28,value);
        iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent(&local_28);
        bVar1 = iVar2 < (int)inputFloat.m_value;
      }
      if (bVar1) {
        minExponent_local = 0;
      }
      else {
        iVar2 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::exponent
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
        SVar3 = tcu::Float<unsigned_int,_8,_23,_127,_3U>::mantissa
                          ((Float<unsigned_int,_8,_23,_127,_3U> *)&truncMask);
        local_2c = tcu::Float<unsigned_int,_8,_23,_127,_3U>::construct
                             (1,iVar2,SVar3 & (local_24 ^ 0xffffffff));
        minExponent_local = (int)tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat(&local_2c);
      }
    }
  }
  else {
    minExponent_local = 0;
  }
  return (float)minExponent_local;
}

Assistant:

static float convertFloatFlushToZeroRtn (float value, int minExponent, int numAccurateBits)
{
	if (value == 0.0f)
	{
		return 0.0f;
	}
	else
	{
		const tcu::Float32	inputFloat			= tcu::Float32(value);
		const int			numTruncatedBits	= 23-numAccurateBits;
		const deUint32		truncMask			= (1u<<numTruncatedBits)-1u;

		if (value > 0.0f)
		{
			if (value > 0.0f && tcu::Float32(value).exponent() < minExponent)
			{
				// flush to zero if possible
				return 0.0f;
			}
			else
			{
				// just mask away non-representable bits
				return tcu::Float32::construct(+1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat();
			}
		}
		else
		{
			if (inputFloat.mantissa() & truncMask)
			{
				// decrement one ulp if truncated bits are non-zero (i.e. if value is not representable)
				return tcu::Float32::construct(-1, inputFloat.exponent(), inputFloat.mantissa() & ~truncMask).asFloat() - getSingleULPForExponent(inputFloat.exponent(), numAccurateBits);
			}
			else
			{
				// value is representable, no need to do anything
				return value;
			}
		}
	}
}